

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

void prvTidyCheckHTML5(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  int iVar2;
  Bool BVar3;
  Node *pNVar4;
  AttVal *pAVar5;
  int local_3c;
  int i;
  AttVal *attr;
  Bool warn;
  Node *body;
  Bool already_strict;
  Bool clean;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  iVar1 = (int)(doc->config).value[0x30].v;
  iVar2 = (int)(doc->config).value[0x51].v;
  pNVar4 = prvTidyFindBody(doc);
  for (_already_strict = node; _already_strict != (Node *)0x0;
      _already_strict = _already_strict->next) {
    BVar3 = nodeHasAlignAttr(_already_strict);
    if ((BVar3 != no) && (iVar2 == 0)) {
      pAVar5 = prvTidyAttrGetById(_already_strict,TidyAttr_ALIGN);
      prvTidyReportAttrError(doc,_already_strict,pAVar5,0x255);
    }
    if (_already_strict == pNVar4) {
      local_3c = 0;
      if (iVar2 == 0) {
        for (; BadBody5Attribs[local_3c] != 0; local_3c = local_3c + 1) {
          pAVar5 = prvTidyAttrGetById(_already_strict,BadBody5Attribs[local_3c]);
          if (pAVar5 != (AttVal *)0x0) {
            prvTidyReportAttrError(doc,_already_strict,pAVar5,0x255);
          }
        }
      }
    }
    else if (((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0)) ||
            (_already_strict->tag->id != TidyTag_ACRONYM)) {
      if (((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0)) ||
         (_already_strict->tag->id != TidyTag_APPLET)) {
        if (((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0)) ||
           (_already_strict->tag->id != TidyTag_BASEFONT)) {
          if (((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0)) ||
             (_already_strict->tag->id != TidyTag_BIG)) {
            if (((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0)) ||
               (_already_strict->tag->id != TidyTag_CENTER)) {
              if (((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0)) ||
                 (_already_strict->tag->id != TidyTag_DIR)) {
                if (((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0)) ||
                   (_already_strict->tag->id != TidyTag_FONT)) {
                  if ((((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0))
                      || (_already_strict->tag->id != TidyTag_FRAME)) &&
                     ((((_already_strict == (Node *)0x0 || (_already_strict->tag == (Dict *)0x0)) ||
                       (_already_strict->tag->id != TidyTag_FRAMESET)) &&
                      (((_already_strict == (Node *)0x0 || (_already_strict->tag == (Dict *)0x0)) ||
                       (_already_strict->tag->id != TidyTag_NOFRAMES)))))) {
                    if (((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0))
                       || (_already_strict->tag->id != TidyTag_STRIKE)) {
                      if (((_already_strict == (Node *)0x0) || (_already_strict->tag == (Dict *)0x0)
                          ) || (_already_strict->tag->id != TidyTag_TT)) {
                        BVar3 = prvTidynodeIsElement(_already_strict);
                        if (((BVar3 != no) && (_already_strict->tag != (Dict *)0x0)) &&
                           (((((_already_strict->tag->versions & 0x60000) == 0 &&
                              ((_already_strict->tag->versions & 0xe000) == 0)) ||
                             (BVar3 = inRemovedInfo(_already_strict->tag->id), BVar3 != no)) &&
                            (iVar2 == 0)))) {
                          prvTidyReport(doc,_already_strict,_already_strict,0x271);
                        }
                      }
                      else if (iVar1 == 0) {
                        if (iVar2 == 0) {
                          prvTidyReport(doc,_already_strict,_already_strict,0x271);
                        }
                      }
                      else {
                        prvTidyAddStyleProperty(doc,_already_strict,"font-family: monospace");
                        prvTidyCoerceNode(doc,_already_strict,TidyTag_SPAN,yes,no);
                      }
                    }
                    else if (iVar1 == 0) {
                      if (iVar2 == 0) {
                        prvTidyReport(doc,_already_strict,_already_strict,0x271);
                      }
                    }
                    else {
                      prvTidyAddStyleProperty(doc,_already_strict,"text-decoration: line-through");
                      prvTidyCoerceNode(doc,_already_strict,TidyTag_SPAN,yes,no);
                    }
                  }
                  else if (iVar2 == 0) {
                    prvTidyReport(doc,_already_strict,_already_strict,0x271);
                  }
                }
                else if (iVar2 == 0) {
                  prvTidyReport(doc,_already_strict,_already_strict,0x271);
                }
              }
              else if (iVar2 == 0) {
                prvTidyReport(doc,_already_strict,_already_strict,0x271);
              }
            }
            else if (iVar2 == 0) {
              prvTidyReport(doc,_already_strict,_already_strict,0x271);
            }
          }
          else if (iVar1 == 0) {
            if (iVar2 == 0) {
              prvTidyReport(doc,_already_strict,_already_strict,0x271);
            }
          }
          else {
            prvTidyAddStyleProperty(doc,_already_strict,"font-size: larger");
            prvTidyCoerceNode(doc,_already_strict,TidyTag_SPAN,yes,no);
          }
        }
        else if (iVar2 == 0) {
          prvTidyReport(doc,_already_strict,_already_strict,0x271);
        }
      }
      else if (iVar1 == 0) {
        if (iVar2 == 0) {
          prvTidyReport(doc,_already_strict,_already_strict,0x271);
        }
      }
      else {
        prvTidyCoerceNode(doc,_already_strict,TidyTag_OBJECT,yes,no);
      }
    }
    else if (iVar1 == 0) {
      if (iVar2 == 0) {
        prvTidyReport(doc,_already_strict,_already_strict,0x271);
      }
    }
    else {
      prvTidyCoerceNode(doc,_already_strict,TidyTag_ABBR,yes,no);
    }
    if (_already_strict->content != (Node *)0x0) {
      prvTidyCheckHTML5(doc,_already_strict->content);
    }
  }
  return;
}

Assistant:

void TY_(CheckHTML5)( TidyDocImpl* doc, Node* node )
{
    Bool clean = cfgBool( doc, TidyMakeClean );
    Bool already_strict = cfgBool( doc, TidyStrictTagsAttr );
    Node* body = TY_(FindBody)( doc );
    Bool warn = yes;    /* should this be a warning, error, or report??? */
    AttVal* attr = NULL;
    int i = 0;

    while (node)
    {
        if ( nodeHasAlignAttr( node ) ) {
            /* @todo: Is this for ALL elements that accept an 'align' attribute,
             * or should this be a sub-set test?
             */

            /* We will only emit this message if `--strict-tags-attributes==no`;
             * otherwise if yes this message will be output during later
             * checking.
             */
            if ( !already_strict )
                TY_(ReportAttrError)(doc, node, TY_(AttrGetById)(node, TidyAttr_ALIGN), MISMATCHED_ATTRIBUTE_WARN);
        }
        if ( node == body ) {
            i = 0;
            /* We will only emit these messages if `--strict-tags-attributes==no`;
             * otherwise if yes these messages will be output during later
             * checking.
             */
            if ( !already_strict ) {
                while ( BadBody5Attribs[i] != TidyAttr_UNKNOWN ) {
                    attr = TY_(AttrGetById)(node, BadBody5Attribs[i]);
                    if ( attr )
                        TY_(ReportAttrError)(doc, node, attr , MISMATCHED_ATTRIBUTE_WARN);
                    i++;
                }
            }
        } else
        if ( nodeIsACRONYM(node) ) {
            if (clean) {
                /* Replace with 'abbr' with warning to that effect.
                 * Maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
                 */
                TY_(CoerceNode)(doc, node, TidyTag_ABBR, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsAPPLET(node) ) {
            if (clean) {
                /* replace with 'object' with warning to that effect
                 * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
                 */
                TY_(CoerceNode)(doc, node, TidyTag_OBJECT, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsBASEFONT(node) ) {
            /* basefont: CSS equivalent 'font-size', 'font-family' and 'color' 
             * on body or class on each subsequent element.
             * Difficult - If it is the first body element, then could consider
             * adding that to the <body> as a whole, else could perhaps apply it
             * to all subsequent elements. But also in consideration is the fact
             * that it was NOT supported in many browsers.
             * - For now just report a warning
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsBIG(node) ) {
            /* big: CSS equivalent 'font-size:larger'
             * so could replace the <big> ... </big> with
             * <span style="font-size: larger"> ... </span>
             * then replace <big> with <span>
             * Need to think about that...
             * Could use -
             *   TY_(AddStyleProperty)( doc, node, "font-size: larger" );
             *   TY_(CoerceNode)(doc, node, TidyTag_SPAN, no, no);
             * Alternatively generated a <style> but how to get the style name
             * TY_(AddAttribute)( doc, node, "class", "????" );
             * Also maybe need a specific message like
             * Element '%s' replaced with 'span' with a 'font-size: larger style attribute
             * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
             */
            if (clean) {
                TY_(AddStyleProperty)( doc, node, "font-size: larger" );
                TY_(CoerceNode)(doc, node, TidyTag_SPAN, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsCENTER(node) ) {
            /* center: CSS equivalent 'text-align:center'
             * and 'margin-left:auto; margin-right:auto' on descendant blocks
             * Tidy already handles this if 'clean' by SILENTLY generating the
             * <style> and adding a <div class="c1"> around the elements.
             * see: static Bool Center2Div( TidyDocImpl* doc, Node *node, Node **pnode)
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsDIR(node) ) {
            /* dir: replace by <ul>
             * Tidy already actions this and issues a warning
             * Should this be CHANGED???
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsFONT(node) ) {
            /* Tidy already handles this -
             * If 'clean' replaced by CSS, else
             * if is NOT clean, and doctype html5 then warnings issued
             * done in Bool Font2Span( TidyDocImpl* doc, Node *node, Node **pnode ) (I think?)
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if (( nodesIsFRAME(node) ) || ( nodeIsFRAMESET(node) ) || ( nodeIsNOFRAMES(node) )) {
            /* YOW: What to do here?????? Maybe <iframe>????
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsSTRIKE(node) ) {
            /* strike: CSS equivalent 'text-decoration:line-through'
             * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
             */
            if (clean) {
                TY_(AddStyleProperty)( doc, node, "text-decoration: line-through" );
                TY_(CoerceNode)(doc, node, TidyTag_SPAN, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsTT(node) ) {
            /* tt: CSS equivalent 'font-family:monospace'
             * Tidy presently does nothing. Tidy5 issues a warning
             * But like the 'clean' <font> replacement this could also be replaced with CSS
             * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
             */
            if (clean) {
                TY_(AddStyleProperty)( doc, node, "font-family: monospace" );
                TY_(CoerceNode)(doc, node, TidyTag_SPAN, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
            if (TY_(nodeIsElement)(node)) {
                if (node->tag) {
                    if ( (!(node->tag->versions & VERS_HTML5) && !(node->tag->versions & VERS_PROPRIETARY)) || (inRemovedInfo(node->tag->id)) ) {
                        if ( !already_strict )
                            TY_(Report)(doc, node, node, REMOVED_HTML5);
                    }
                }
            }

        if (node->content)
            TY_(CheckHTML5)( doc, node->content );
        
        node = node->next;
    }
}